

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_step(sqlite3_stmt *pStmt)

{
  sqlite3 *db;
  sqlite3 *psVar1;
  sqlite3 *db_00;
  Btree *p_00;
  Wal *pWVar2;
  uint *puVar3;
  int iVar4;
  Vdbe *pVVar5;
  Vdbe *pVVar6;
  Vdbe *pVVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Vdbe *p_01;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  undefined8 *puVar15;
  uchar *z;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  undefined8 uVar20;
  Vdbe *p;
  int i;
  long lVar21;
  ulong uVar22;
  char *pcVar23;
  sqlite3_stmt *psVar24;
  int n;
  byte *pbVar25;
  byte bVar26;
  long lVar27;
  int rc;
  Mem *pMem;
  Mem *p_02;
  u32 uVar28;
  uint local_1b0;
  int local_1ac;
  Vdbe *local_160;
  StrAccum local_158 [9];
  
  iVar11 = vdbeSafetyNotNull((Vdbe *)pStmt);
  if (iVar11 != 0) {
    iVar11 = sqlite3MisuseError(0x14046);
    return iVar11;
  }
  db = *(sqlite3 **)pStmt;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  pStmt[0xc5] = (sqlite3_stmt)((byte)pStmt[0xc5] & 0xef);
  local_1ac = 0;
  do {
    if (*(int *)(pStmt + 0x24) != 0x2df20da3) {
      sqlite3_reset(pStmt);
    }
    psVar1 = *(sqlite3 **)pStmt;
    local_1b0 = 7;
    if (psVar1->mallocFailed != '\0') goto LAB_00120987;
    uVar10 = *(ushort *)(pStmt + 0xc5);
    if (*(int *)(pStmt + 0x34) < 0) {
      if ((uVar10 & 3) == 0) {
        iVar11 = psVar1->nVdbeActive;
        if (iVar11 == 0) {
          (psVar1->u1).isInterrupted = 0;
        }
        if ((((psVar1->mTrace & 0x82) != 0) && ((psVar1->init).busy == '\0')) &&
           (*(long *)(pStmt + 0xf0) != 0)) {
          sqlite3OsCurrentTimeInt64(psVar1->pVfs,(sqlite3_int64 *)(pStmt + 0xb8));
          iVar11 = psVar1->nVdbeActive;
        }
        psVar1->nVdbeActive = iVar11 + 1;
        uVar10 = *(ushort *)(pStmt + 0xc5);
        if ((uVar10 >> 8 & 1) == 0) {
          psVar1->nVdbeWrite = psVar1->nVdbeWrite + 1;
          uVar10 = *(ushort *)(pStmt + 0xc5);
        }
        if ((uVar10 >> 9 & 1) != 0) {
          psVar1->nVdbeRead = psVar1->nVdbeRead + 1;
          uVar10 = *(ushort *)(pStmt + 0xc5);
        }
        *(undefined4 *)(pStmt + 0x34) = 0;
        goto LAB_0011ff1c;
      }
      *(undefined4 *)(pStmt + 0x38) = 0x11;
      local_1b0 = 1;
      goto LAB_00120307;
    }
LAB_0011ff1c:
    if ((uVar10 & 0xc) == 0) {
      psVar1->nVdbeExec = psVar1->nVdbeExec + 1;
      uVar12 = sqlite3VdbeExec((Vdbe *)pStmt);
      psVar1->nVdbeExec = psVar1->nVdbeExec + -1;
      local_1b0 = 100;
      if (uVar12 != 100) goto LAB_001201ee;
      goto LAB_001202d9;
    }
    db_00 = *(sqlite3 **)pStmt;
    bVar26 = 1;
    if ((uVar10 & 0xc) != 4) {
      bVar26 = *(byte *)((long)&db_00->flags + 3) & 1;
    }
    lVar21 = *(long *)(pStmt + 0x68);
    p_02 = (Mem *)(lVar21 + 0x38);
    releaseMemArray(p_02,8);
    *(undefined8 *)(pStmt + 0xa0) = 0;
    if (*(int *)(pStmt + 0x38) == 7) {
      sqlite3OomFault(db_00);
LAB_0011ff60:
      uVar12 = 1;
      goto LAB_001201ee;
    }
    iVar11 = *(int *)(pStmt + 0x90);
    if (bVar26 == 0) {
      pMem = (Mem *)0x0;
      pcVar16 = (char *)0x0;
      uVar22 = 0;
    }
    else {
      lVar27 = *(long *)(pStmt + 0x68);
      if ((*(byte *)(lVar27 + 0x200) & 0x10) == 0) {
        pcVar16 = (char *)0x0;
        uVar22 = 0;
      }
      else {
        uVar22 = (ulong)(uint)(*(int *)(lVar27 + 0x204) >> 3);
        pcVar16 = *(char **)(lVar27 + 0x208);
      }
      pMem = (Mem *)(lVar27 + 0x1f8);
      uVar17 = 0;
      if (0 < (int)uVar22) {
        uVar17 = uVar22;
      }
      for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
        iVar11 = iVar11 + *(int *)(*(long *)(pcVar16 + uVar18 * 8) + 8);
      }
    }
LAB_0012008e:
    do {
      iVar14 = *(int *)(pStmt + 0x34);
      *(int *)(pStmt + 0x34) = iVar14 + 1;
      if (iVar11 <= iVar14) {
        *(undefined4 *)(pStmt + 0x38) = 0;
        uVar12 = 0x65;
        goto LAB_001201ee;
      }
      pcVar23 = pcVar16;
      psVar24 = pStmt + 0x88;
      iVar4 = iVar14 - *(int *)(pStmt + 0x90);
      if (*(int *)(pStmt + 0x90) <= iVar14) {
        while( true ) {
          iVar14 = iVar4;
          psVar24 = *(sqlite3_stmt **)pcVar23;
          if (iVar14 < *(int *)(psVar24 + 8)) break;
          pcVar23 = pcVar23 + 8;
          iVar4 = iVar14 - *(int *)(psVar24 + 8);
        }
      }
      pbVar25 = (byte *)((long)iVar14 * 0x18 + *(long *)psVar24);
      if ((bVar26 != 0) && (pbVar25[1] == 0xfc)) {
        iVar4 = (int)uVar22;
        n = iVar4 * 8 + 8;
        uVar17 = 0;
        if (0 < iVar4) {
          uVar17 = uVar22;
        }
        for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
          if (*(long *)(pcVar16 + uVar18 * 8) == *(long *)(pbVar25 + 0x10)) {
            uVar17 = uVar18 & 0xffffffff;
            break;
          }
        }
        if ((int)uVar17 == iVar4) {
          iVar13 = sqlite3VdbeMemGrow(pMem,n,(uint)(iVar4 != 0));
          *(int *)(pStmt + 0x38) = iVar13;
          if (iVar13 != 0) goto LAB_0011ff60;
          pcVar16 = pMem->z;
          *(undefined8 *)(pcVar16 + (long)iVar4 * 8) = *(undefined8 *)(pbVar25 + 0x10);
          *(byte *)&pMem->flags = (byte)pMem->flags | 0x10;
          pMem->n = n;
          iVar11 = iVar11 + *(int *)(*(long *)(pbVar25 + 0x10) + 8);
          uVar22 = (ulong)(iVar4 + 1);
        }
      }
      if ((*(ushort *)(pStmt + 0xc5) & 8) == 0) break;
      if (*pbVar25 != 0x3d) {
        if (*pbVar25 == 0xab) break;
        goto LAB_0012008e;
      }
    } while (*(int *)(pStmt + 0x34) < 2);
    if ((db_00->u1).isInterrupted != 0) {
      *(undefined4 *)(pStmt + 0x38) = 9;
      sqlite3VdbeError((Vdbe *)pStmt,"interrupted");
      uVar12 = 1;
      goto LAB_001201ee;
    }
    if ((*(ushort *)(pStmt + 0xc5) & 0xc) == 4) {
      *(undefined2 *)(lVar21 + 0x40) = 4;
      *(long *)(lVar21 + 0x38) = (long)iVar14;
      *(undefined2 *)(lVar21 + 0x78) = 0xa02;
      pcVar16 = *(char **)(sqlite3OpcodeName_azName + (ulong)*pbVar25 * 8);
      *(char **)(lVar21 + 0x80) = pcVar16;
      iVar11 = sqlite3Strlen30(pcVar16);
      *(int *)(lVar21 + 0x7c) = iVar11;
      *(undefined1 *)(lVar21 + 0x7a) = 1;
      p_02 = (Mem *)(lVar21 + 0xa8);
    }
    p_02->flags = 4;
    p_02->u = (MemValue)(long)*(int *)(pbVar25 + 4);
    p_02[1].flags = 4;
    p_02[1].u = (MemValue)(long)*(int *)(pbVar25 + 8);
    p_02[2].flags = 4;
    p_02[2].u = (MemValue)(long)*(int *)(pbVar25 + 0xc);
    iVar11 = sqlite3VdbeMemClearAndResize(p_02 + 3,100);
    uVar12 = 1;
    if (iVar11 != 0) goto LAB_001201ee;
    p_02[3].flags = 0x202;
    pcVar16 = p_02[3].z;
    local_158[0].nAlloc = p_02[3].szMalloc;
    local_158[0].db = (sqlite3 *)0x0;
    local_158[0].accError = '\0';
    local_158[0].printfFlags = '\0';
    local_158[0].mxAlloc = 0;
    local_158[0].nChar = 0;
    pcVar23 = pcVar16;
    local_158[0].zText = pcVar16;
    switch(pbVar25[1]) {
    case 0xef:
    case 0xfb:
      *pcVar16 = '\0';
      break;
    default:
      pcVar23 = *(char **)(pbVar25 + 0x10);
      if (*(char **)(pbVar25 + 0x10) == (char *)0x0) {
        *pcVar16 = '\0';
        pcVar23 = pcVar16;
      }
      break;
    case 0xf1:
      puVar3 = *(uint **)(pbVar25 + 0x10);
      uVar12 = *puVar3;
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      for (uVar22 = 0; uVar12 != uVar22; uVar22 = uVar22 + 1) {
        sqlite3_str_appendf(local_158,",%d",(ulong)puVar3[uVar22 + 1]);
      }
      *pcVar16 = '[';
      pcVar16 = "[]";
      goto LAB_0012078c;
    case 0xf2:
      puVar15 = *(undefined8 **)(pbVar25 + 0x10);
LAB_0012063b:
      uVar20 = *puVar15;
      pcVar16 = "%lld";
      goto LAB_001207cd;
    case 0xf3:
      sqlite3_str_appendf(local_158,"%.16g",(int)**(undefined8 **)(pbVar25 + 0x10));
      break;
    case 0xf4:
      uVar20 = *(undefined8 *)(*(long *)(pbVar25 + 0x10) + 0x10);
      pcVar16 = "vtab:%p";
      goto LAB_001207cd;
    case 0xf5:
      puVar15 = *(undefined8 **)(pbVar25 + 0x10);
      uVar10 = *(ushort *)(puVar15 + 1);
      if ((uVar10 & 2) == 0) {
        if ((uVar10 & 4) != 0) goto LAB_0012063b;
        if ((uVar10 & 8) == 0) {
          pcVar23 = "NULL";
          if ((uVar10 & 1) == 0) {
            pcVar23 = "(blob)";
          }
        }
        else {
          sqlite3_str_appendf(local_158,"%.16g",(int)*puVar15);
        }
      }
      else {
        pcVar23 = (char *)puVar15[2];
      }
      break;
    case 0xf7:
      lVar21 = *(long *)(pbVar25 + 0x10);
      sqlite3_str_appendf(local_158,"k(%d",(ulong)*(ushort *)(lVar21 + 6));
      for (uVar22 = 0; uVar22 < *(ushort *)(lVar21 + 6); uVar22 = uVar22 + 1) {
        puVar15 = *(undefined8 **)(lVar21 + 0x20 + uVar22 * 8);
        pcVar16 = "";
        if (puVar15 != (undefined8 *)0x0) {
          pcVar16 = (char *)*puVar15;
        }
        iVar11 = strcmp(pcVar16,"BINARY");
        if (iVar11 == 0) {
          pcVar16 = "B";
        }
        pcVar19 = "-";
        if (*(char *)(*(long *)(lVar21 + 0x18) + uVar22) == '\0') {
          pcVar19 = "";
        }
        sqlite3_str_appendf(local_158,",%s%s",pcVar19,pcVar16);
      }
      pcVar16 = "\n)";
LAB_0012078c:
      sqlite3_str_append(local_158,pcVar16 + 1,1);
      break;
    case 0xf8:
      sqlite3_str_appendf(local_158,"%s(%d)",*(undefined8 *)(*(char **)(pbVar25 + 0x10) + 0x38),
                          (ulong)(uint)(int)**(char **)(pbVar25 + 0x10));
      break;
    case 0xfa:
      uVar20 = **(undefined8 **)(pbVar25 + 0x10);
      pcVar16 = "%s";
      goto LAB_001207cd;
    case 0xfc:
      sqlite3_str_appendf(local_158,"program");
      break;
    case 0xfd:
      sqlite3_str_appendf(local_158,"%d",(ulong)*(uint *)(pbVar25 + 0x10));
      break;
    case 0xfe:
      uVar20 = **(undefined8 **)(pbVar25 + 0x10);
      pcVar16 = "(%.20s)";
LAB_001207cd:
      sqlite3_str_appendf(local_158,pcVar16,uVar20);
    }
    sqlite3StrAccumFinish(local_158);
    if (pcVar23 == p_02[3].z) {
      iVar11 = sqlite3Strlen30(p_02[3].z);
      p_02[3].n = iVar11;
      p_02[3].enc = '\x01';
    }
    else {
      p_02[3].n = 0;
      sqlite3VdbeMemSetStr(p_02 + 3,pcVar23,-1,'\x01',(_func_void_void_ptr *)0x0);
    }
    uVar10 = *(ushort *)(pStmt + 0xc5) & 0xc;
    if (uVar10 == 4) {
      iVar11 = sqlite3VdbeMemClearAndResize(p_02 + 4,4);
      uVar12 = 1;
      if (iVar11 == 0) {
        p_02[4].flags = 0x202;
        p_02[4].n = 2;
        sqlite3_snprintf(3,p_02[4].z,"%.2x",(ulong)*(ushort *)(pbVar25 + 2));
        p_02[4].enc = '\x01';
        p_02[5].flags = 1;
        uVar10 = *(ushort *)(pStmt + 0xc5) & 0xc;
        goto LAB_001208a6;
      }
LAB_001201ee:
      local_1b0 = uVar12;
      if (0 < *(long *)(pStmt + 0xb8)) {
        invokeProfileCallback(psVar1,(Vdbe *)pStmt);
      }
      if ((local_1b0 == 0x65) && (local_1b0 = 0x65, psVar1->autoCommit != '\0')) {
        lVar27 = 0;
        iVar11 = 0;
        for (lVar21 = 0; lVar21 < psVar1->nDb; lVar21 = lVar21 + 1) {
          p_00 = *(Btree **)((long)&psVar1->aDb->pBt + lVar27);
          if (p_00 != (Btree *)0x0) {
            sqlite3BtreeEnter(p_00);
            pWVar2 = p_00->pBt->pPager->pWal;
            if (pWVar2 == (Wal *)0x0) {
              uVar28 = 0;
            }
            else {
              uVar28 = pWVar2->iCallback;
              pWVar2->iCallback = 0;
            }
            sqlite3BtreeLeave(p_00);
            if (((0 < (int)uVar28) &&
                (psVar1->xWalCallback != (_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0)) &&
               (iVar11 == 0)) {
              iVar11 = (*psVar1->xWalCallback)
                                 (psVar1->pWalArg,psVar1,
                                  *(char **)((long)&psVar1->aDb->zDbSName + lVar27),uVar28);
            }
          }
          lVar27 = lVar27 + 0x20;
        }
        *(int *)(pStmt + 0x38) = iVar11;
        local_1b0 = 1;
        if (iVar11 == 0) {
          local_1b0 = 0x65;
        }
      }
    }
    else {
LAB_001208a6:
      *(ushort *)(pStmt + 0xc0) = uVar10 ^ 0xc;
      *(long *)(pStmt + 0xa0) = *(long *)(pStmt + 0x68) + 0x38;
      *(undefined4 *)(pStmt + 0x38) = 0;
      local_1b0 = 100;
    }
LAB_001202d9:
    psVar1->errCode = local_1b0;
    iVar11 = sqlite3ApiExit(*(sqlite3 **)pStmt,*(int *)(pStmt + 0x38));
    if (iVar11 == 7) {
      *(undefined4 *)(pStmt + 0x38) = 7;
    }
    if (local_1b0 - 0x66 < 0xfffffffe) {
LAB_00120307:
      if ((char)pStmt[0xc4] < '\0') {
        local_1b0 = sqlite3VdbeTransferError((Vdbe *)pStmt);
      }
    }
    local_1b0 = local_1b0 & psVar1->errMask;
    if (local_1b0 != 0x11) goto LAB_00120991;
    if (local_1ac == 0x32) {
      local_1b0 = 0x11;
      goto LAB_00120991;
    }
    iVar11 = *(int *)(pStmt + 0x34);
    psVar1 = *(sqlite3 **)pStmt;
    iVar14 = sqlite3LockAndPrepare
                       (psVar1,*(char **)(pStmt + 0xf0),-1,(uint)(byte)pStmt[0xc4],(Vdbe *)pStmt,
                        (sqlite3_stmt **)&local_160,(char **)0x0);
    p_01 = local_160;
    if (iVar14 != 0) {
      if (iVar14 == 7) {
        sqlite3OomFault(psVar1);
      }
      z = sqlite3_value_text(db->pErr);
      sqlite3DbFree(db,*(void **)(pStmt + 0xa8));
      if (db->mallocFailed == '\0') {
        pcVar16 = sqlite3DbStrDup(db,(char *)z);
        *(char **)(pStmt + 0xa8) = pcVar16;
        local_1b0 = sqlite3ApiExit(db,iVar14);
      }
      else {
        *(undefined8 *)(pStmt + 0xa8) = 0;
        local_1b0 = 7;
      }
LAB_00120987:
      *(uint *)(pStmt + 0x38) = local_1b0;
LAB_00120991:
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      }
      return local_1b0;
    }
    local_1ac = local_1ac + 1;
    memcpy(local_158,local_160,0x128);
    memcpy(p_01,pStmt,0x128);
    memcpy(pStmt,local_158,0x128);
    pVVar5 = *(Vdbe **)(pStmt + 0x10);
    pVVar6 = p_01->pPrev;
    pVVar7 = p_01->pNext;
    p_01->pPrev = *(Vdbe **)(pStmt + 8);
    p_01->pNext = pVVar5;
    *(Vdbe **)(pStmt + 8) = pVVar6;
    *(Vdbe **)(pStmt + 0x10) = pVVar7;
    pcVar16 = p_01->zSql;
    p_01->zSql = *(char **)(pStmt + 0xf0);
    *(char **)(pStmt + 0xf0) = pcVar16;
    *(u32 *)(pStmt + 0x114) = p_01->expmask;
    pStmt[0xc4] = (sqlite3_stmt)p_01->prepFlags;
    uVar20 = *(undefined8 *)p_01->aCounter;
    uVar8 = *(undefined8 *)(p_01->aCounter + 2);
    uVar9 = *(undefined8 *)(p_01->aCounter + 5);
    *(undefined8 *)(pStmt + 0xdc) = *(undefined8 *)(p_01->aCounter + 3);
    *(undefined8 *)(pStmt + 0xe4) = uVar9;
    *(undefined8 *)(pStmt + 0xd0) = uVar20;
    *(undefined8 *)(pStmt + 0xd8) = uVar8;
    *(int *)(pStmt + 0xe4) = *(int *)(pStmt + 0xe4) + 1;
    sqlite3TransferBindings((sqlite3_stmt *)p_01,pStmt);
    p_01->rc = 0;
    sqlite3VdbeFinalize(p_01);
    sqlite3_reset(pStmt);
    if (-1 < iVar11) {
      pStmt[0xc5] = (sqlite3_stmt)((byte)pStmt[0xc5] | 0x10);
    }
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  v->doingRerun = 0;
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK ){
      /* This case occurs after failing to recompile an sql statement. 
      ** The error message from the SQL compiler has already been loaded 
      ** into the database handle. This block copies the error message 
      ** from the database handle into the statement and sets the statement
      ** program counter to 0 to ensure that when the statement is 
      ** finalized or reset the parser error message is available via
      ** sqlite3_errmsg() and sqlite3_errcode().
      */
      const char *zErr = (const char *)sqlite3_value_text(db->pErr); 
      sqlite3DbFree(db, v->zErrMsg);
      if( !db->mallocFailed ){
        v->zErrMsg = sqlite3DbStrDup(db, zErr);
        v->rc = rc = sqlite3ApiExit(db, rc);
      } else {
        v->zErrMsg = 0;
        v->rc = rc = SQLITE_NOMEM_BKPT;
      }
      break;
    }
    sqlite3_reset(pStmt);
    if( savedPc>=0 ) v->doingRerun = 1;
    assert( v->expired==0 );
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}